

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O3

void Abc_TtHieManStop(Abc_TtHieMan_t *p)

{
  Vec_Mem_t *pVVar1;
  int *piVar2;
  bool bVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  long lVar6;
  long lVar7;
  
  if (-1 < p->nLastLevel) {
    lVar7 = 0;
    do {
      pVVar1 = p->vTtMem[lVar7];
      if (pVVar1 != (Vec_Mem_t *)0x0) {
        pVVar5 = pVVar1->vTable;
        if (pVVar5 != (Vec_Int_t *)0x0) {
          if (pVVar5->pArray != (int *)0x0) {
            free(pVVar5->pArray);
            pVVar1->vTable->pArray = (int *)0x0;
            pVVar5 = pVVar1->vTable;
            if (pVVar5 == (Vec_Int_t *)0x0) goto LAB_004d5cd2;
          }
          free(pVVar5);
          pVVar1->vTable = (Vec_Int_t *)0x0;
        }
LAB_004d5cd2:
        pVVar5 = pVVar1->vNexts;
        if (pVVar5 != (Vec_Int_t *)0x0) {
          if (pVVar5->pArray != (int *)0x0) {
            free(pVVar5->pArray);
            pVVar1->vNexts->pArray = (int *)0x0;
            pVVar5 = pVVar1->vNexts;
            if (pVVar5 == (Vec_Int_t *)0x0) goto LAB_004d5d0e;
          }
          free(pVVar5);
          pVVar1->vNexts = (Vec_Int_t *)0x0;
        }
LAB_004d5d0e:
        pVVar1 = p->vTtMem[lVar7];
        if (pVVar1 != (Vec_Mem_t *)0x0) {
          iVar4 = pVVar1->iPage;
          if (-1 < iVar4) {
            lVar6 = -1;
            do {
              if (pVVar1->ppPages[lVar6 + 1] != (word *)0x0) {
                free(pVVar1->ppPages[lVar6 + 1]);
                pVVar1->ppPages[lVar6 + 1] = (word *)0x0;
                iVar4 = pVVar1->iPage;
              }
              lVar6 = lVar6 + 1;
            } while (lVar6 < iVar4);
          }
          if (pVVar1->ppPages != (word **)0x0) {
            free(pVVar1->ppPages);
          }
          free(pVVar1);
          p->vTtMem[lVar7] = (Vec_Mem_t *)0x0;
        }
      }
      pVVar5 = p->vRepres[lVar7];
      piVar2 = pVVar5->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
      }
      free(pVVar5);
      bVar3 = lVar7 < p->nLastLevel;
      lVar7 = lVar7 + 1;
    } while (bVar3);
  }
  pVVar5 = p->vPhase;
  piVar2 = pVVar5->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar5);
  free(p);
  return;
}

Assistant:

void Abc_TtHieManStop(Abc_TtHieMan_t * p)
{
    int i;
    for (i = 0; i <= p->nLastLevel; i++)
    {
        Vec_MemHashFree(p->vTtMem[i]);
        Vec_MemFreeP(&p->vTtMem[i]);
        Vec_IntFree(p->vRepres[i]);
    }
    Vec_IntFree( p->vPhase );
    ABC_FREE(p);
}